

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O0

void newbltchar(LispPTR *args)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint h_00;
  uint uVar5;
  uint uVar6;
  LispPTR *pLVar7;
  DLword *pDVar8;
  LispPTR *pLVar9;
  DLword *ybase;
  DLword *pDVar10;
  sbyte sVar11;
  long lVar13;
  bool bVar14;
  uint local_178;
  uint local_174;
  uint local_134;
  uint local_130;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  uint local_110;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_a0;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  int newpos;
  int gray;
  DLword *dstbase;
  DLword *srcbase;
  int op;
  int src_comp;
  int dstbpl;
  int srcbpl;
  int dx;
  int sx;
  int backwardflg;
  int w;
  int h;
  int base;
  int xoff;
  int rmargin;
  int lmargin;
  PILOTBBT *pbt;
  uint local_20;
  int curx;
  int left;
  int right;
  DISPLAYDATA *displaydata68k;
  LispPTR *args_local;
  sbyte sVar12;
  
  pLVar7 = NativeAligned4FromLAddr(args[2]);
  if ((pLVar7[0x1f] & 0xffff) == (uint)(ushort)((ushort)*args >> 8)) {
    if (pLVar7[7] == 0) {
      if ((*pLVar7 & 0xfff0000) == 0xe0000) {
        pbt._4_4_ = *pLVar7 & 0xffff;
      }
      else {
        if ((*pLVar7 & 0xfff0000) != 0xf0000) {
          if ((BLTCHAR_index == 0) &&
             (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
             BLTCHAR_index == 0xffffffff)) {
            return;
          }
          MachineState.csp = MachineState.csp + 4;
          ccfuncall(BLTCHAR_index,3,3);
          return;
        }
        pbt._4_4_ = *pLVar7 | 0xffff0000;
      }
      if ((pLVar7[0xc] & 0xfff0000) == 0xe0000) {
        base = pLVar7[0xc] & 0xffff;
      }
      else {
        if ((pLVar7[0xc] & 0xfff0000) != 0xf0000) {
          if ((BLTCHAR_index == 0) &&
             (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
             BLTCHAR_index == 0xffffffff)) {
            return;
          }
          MachineState.csp = MachineState.csp + 4;
          ccfuncall(BLTCHAR_index,3,3);
          return;
        }
        base = pLVar7[0xc] | 0xffff0000;
      }
      if ((pLVar7[0xd] & 0xfff0000) == 0xe0000) {
        xoff = pLVar7[0xd] & 0xffff;
      }
      else {
        if ((pLVar7[0xd] & 0xfff0000) != 0xf0000) {
          if ((BLTCHAR_index == 0) &&
             (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
             BLTCHAR_index == 0xffffffff)) {
            return;
          }
          MachineState.csp = MachineState.csp + 4;
          ccfuncall(BLTCHAR_index,3,3);
          return;
        }
        xoff = pLVar7[0xd] | 0xffff0000;
      }
      if ((pLVar7[2] & 0xfff0000) == 0xe0000) {
        h = pLVar7[2] & 0xffff;
      }
      else {
        if ((pLVar7[2] & 0xfff0000) != 0xf0000) {
          if ((BLTCHAR_index == 0) &&
             (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
             BLTCHAR_index == 0xffffffff)) {
            return;
          }
          MachineState.csp = MachineState.csp + 4;
          ccfuncall(BLTCHAR_index,3,3);
          return;
        }
        h = pLVar7[2] | 0xffff0000;
      }
      pDVar8 = NativeAligned2FromLAddr(pLVar7[0x18] + (uint)((ushort)*args & 0xff));
      iVar3 = pbt._4_4_ + *(ushort *)((ulong)pDVar8 ^ 2);
      if ((base < iVar3) && (xoff < (int)pbt._4_4_)) {
        if ((BLTCHAR_index != 0) ||
           (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
           BLTCHAR_index != 0xffffffff)) {
          MachineState.csp = MachineState.csp + 4;
          ccfuncall(BLTCHAR_index,3,3);
        }
      }
      else if (args[1] == *TOPWDS68k) {
        pDVar8 = NativeAligned2FromLAddr(pLVar7[8] + (uint)((ushort)*args & 0xff));
        uVar4 = pbt._4_4_ + *(ushort *)((ulong)pDVar8 ^ 2);
        if (((int)uVar4 < 0) || (0xffff < (int)uVar4)) {
          if ((int)uVar4 < -0x10000) {
            if ((BLTCHAR_index == 0) &&
               (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
               BLTCHAR_index == 0xffffffff)) {
              return;
            }
            MachineState.csp = MachineState.csp + 4;
            ccfuncall(BLTCHAR_index,3,3);
            return;
          }
          *pLVar7 = uVar4 & 0xffff | 0xf0000;
        }
        else {
          *pLVar7 = uVar4 | 0xe0000;
        }
        uVar4 = h + pbt._4_4_;
        curx = h + iVar3;
        if ((int)(uint)(ushort)pLVar7[0x11] < curx) {
          curx = (int)(ushort)pLVar7[0x11];
        }
        local_20 = uVar4;
        if ((int)uVar4 <= (int)(uint)*(ushort *)((long)pLVar7 + 0x46)) {
          local_20 = (uint)*(ushort *)((long)pLVar7 + 0x46);
        }
        pLVar9 = NativeAligned4FromLAddr(pLVar7[0x15]);
        h_00 = (uint)(ushort)pLVar9[4];
        iVar3 = curx - local_20;
        if ((h_00 != 0) && (0 < iVar3)) {
          pDVar8 = NativeAligned2FromLAddr
                             (CONCAT22((short)pLVar9[2],*(undefined2 *)((long)pLVar9 + 10)));
          ybase = NativeAligned2FromLAddr
                            (CONCAT22((short)*pLVar9,*(undefined2 *)((long)pLVar9 + 2)));
          uVar1 = *(ushort *)((long)pLVar9 + 0x16) >> 9 & 3;
          uVar2 = *(ushort *)((long)pLVar9 + 0x16) >> 0xb & 1;
          uVar5 = (uint)(short)pLVar9[3];
          if ((int)uVar5 < 1) {
            uVar5 = -uVar5;
          }
          uVar6 = (uint)(short)pLVar9[1];
          if ((int)uVar6 < 1) {
            uVar6 = -uVar6;
          }
          pDVar10 = NativeAligned2FromLAddr(pLVar7[9] + (uint)((ushort)*args & 0xff));
          uVar4 = (*(ushort *)((ulong)pDVar10 ^ 2) + local_20) - uVar4;
          ScreenLocked = 1;
          srcRshift = 0;
          if ((int)local_20 < 0) {
            lVar13 = -(long)((int)(7 - local_20) >> 3);
          }
          else {
            lVar13 = (long)((int)local_20 >> 3);
          }
          x32nbyt = (long)ybase + lVar13;
          _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
          dstold = (int)((x32nbyt & 3) << 3) + (local_20 & 7);
          fwd = (dstold + iVar3) - 1 & 0x1f;
          if (dstold == 0) {
            local_130 = 0xffffffff;
          }
          else {
            local_130 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_130 & dst32addr._4_4_;
          srcLshift = ((int)(dstold + iVar3) >> 5) + -1;
          if ((int)uVar4 < 0) {
            lVar13 = -(long)((int)(7 - uVar4) >> 3);
          }
          else {
            lVar13 = (long)((int)uVar4 >> 3);
          }
          x32nbyt = (long)pDVar8 + lVar13;
          OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
          dst32lbit = (int)((x32nbyt & 3) << 3) + (uVar4 & 7);
          OrigSrcAddr._4_4_ = (dst32lbit + iVar3) - 1U & 0x1f;
          srcRmask = dst32lbit - dstold & 0x1f;
          if (srcRmask == 0) {
            local_134 = 0xffffffff;
          }
          else {
            local_134 = -1 << (sbyte)srcRmask ^ 0xffffffff;
          }
          dstdata = local_134;
          sdw_mask = local_130;
          local_110 = dstold - dst32lbit & 0x1f;
          bVar14 = ((uVar5 | uVar6) & 0x1f) != 0;
          src32lbit = h_00;
          while( true ) {
            src32addr = _preloop_mask;
            if (src32lbit < 1) break;
            sVar11 = (sbyte)local_110;
            sVar12 = (sbyte)srcRmask;
            if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + iVar3)) {
              _savedS = OrigDstAddr + 2;
              newS = *OrigDstAddr << sVar12 | OrigDstAddr[1] >> sVar11 & dstdata;
              srcRshift = OrigDstAddr[1] << sVar12 & (dstdata ^ 0xffffffff);
            }
            else {
              if (dstold < (uint)dst32lbit) {
                newS = *OrigDstAddr << sVar12;
              }
              else {
                newS = *OrigDstAddr >> sVar11 & dstdata;
                srcRshift = *OrigDstAddr << sVar12 & (dstdata ^ 0xffffffff);
              }
              _savedS = OrigDstAddr + 1;
            }
            if (uVar2 != 0) {
              newS = newS ^ 0xffffffff;
            }
            if ((int)(dstold + iVar3) < 0x21) {
              x32byta._4_4_ = (uint)dst32addr;
LAB_001196d6:
              local_a0 = *src32addr;
              uVar4 = local_a0 & ~x32byta._4_4_;
              switch(uVar1) {
              case 0:
                local_a0 = newS;
                break;
              case 1:
                local_a0 = newS & local_a0;
                break;
              case 2:
                local_a0 = newS | local_a0;
                break;
              case 3:
                local_a0 = newS ^ local_a0;
              }
              *src32addr = uVar4 | x32byta._4_4_ & local_a0;
            }
            else {
              local_a0 = *_preloop_mask;
              uVar4 = local_a0 & ~sdw_mask;
              switch(uVar1) {
              case 0:
                local_a0 = newS;
                break;
              case 1:
                local_a0 = newS & local_a0;
                break;
              case 2:
                local_a0 = newS | local_a0;
                break;
              case 3:
                local_a0 = newS ^ local_a0;
              }
              *_preloop_mask = uVar4 | sdw_mask & local_a0;
              src32addr = _preloop_mask + 1;
              if (dst32lbit == dstold) {
                if (uVar2 == 0) {
                  switch(uVar1) {
                  case 0:
                    local_118 = srcLshift;
                    while (local_118 = local_118 + -1, -1 < local_118) {
                      *src32addr = *_savedS;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 1:
                    local_118 = srcLshift;
                    while (local_118 = local_118 + -1, -1 < local_118) {
                      *src32addr = *_savedS & *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 2:
                    local_118 = srcLshift;
                    while (local_118 = local_118 + -1, -1 < local_118) {
                      *src32addr = *_savedS | *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 3:
                    local_118 = srcLshift;
                    while (local_118 = local_118 + -1, -1 < local_118) {
                      *src32addr = *_savedS ^ *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                  }
                }
                else {
                  switch(uVar1) {
                  case 0:
                    local_114 = srcLshift;
                    while (local_114 = local_114 + -1, -1 < local_114) {
                      *src32addr = *_savedS ^ 0xffffffff;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 1:
                    local_114 = srcLshift;
                    while (local_114 = local_114 + -1, -1 < local_114) {
                      *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 2:
                    local_114 = srcLshift;
                    while (local_114 = local_114 + -1, -1 < local_114) {
                      *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                    break;
                  case 3:
                    local_114 = srcLshift;
                    while (local_114 = local_114 + -1, -1 < local_114) {
                      *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                      _savedS = _savedS + 1;
                      src32addr = src32addr + 1;
                    }
                  }
                }
              }
              else if (uVar2 == 0) {
                switch(uVar1) {
                case 0:
                  local_120 = srcLshift;
                  while (local_120 = local_120 + -1, -1 < local_120) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 1:
                  local_120 = srcLshift;
                  while (local_120 = local_120 + -1, -1 < local_120) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 & *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 2:
                  local_120 = srcLshift;
                  while (local_120 = local_120 + -1, -1 < local_120) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 | *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 3:
                  local_120 = srcLshift;
                  while (local_120 = local_120 + -1, -1 < local_120) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 ^ *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                }
              }
              else {
                switch(uVar1) {
                case 0:
                  local_11c = srcLshift;
                  while (local_11c = local_11c + -1, -1 < local_11c) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 ^ 0xffffffff;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 1:
                  local_11c = srcLshift;
                  while (local_11c = local_11c + -1, -1 < local_11c) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = (uVar4 ^ 0xffffffff) & *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 2:
                  local_11c = srcLshift;
                  while (local_11c = local_11c + -1, -1 < local_11c) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 ^ 0xffffffff | *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                  break;
                case 3:
                  local_11c = srcLshift;
                  while (local_11c = local_11c + -1, -1 < local_11c) {
                    uVar4 = srcRshift | *_savedS >> sVar11;
                    srcRshift = *_savedS << sVar12;
                    *src32addr = uVar4 ^ 0xffffffff ^ *src32addr;
                    _savedS = _savedS + 1;
                    src32addr = src32addr + 1;
                  }
                }
              }
              if (fwd != 0x1f) {
                if ((uint)fwd < OrigSrcAddr._4_4_) {
                  newS = srcRshift;
                }
                else {
                  newS = srcRshift | *_savedS >> sVar11 & dstdata;
                }
                if (uVar2 != 0) {
                  newS = newS ^ 0xffffffff;
                }
                x32byta._4_4_ = dst32addr._4_4_;
                goto LAB_001196d6;
              }
            }
            uVar4 = uVar6;
            if (bVar14) {
              uVar4 = uVar6 + dstold;
              dstold = uVar4 & 0x1f;
              fwd = (dstold + iVar3) - 1 & 0x1f;
              if (dstold == 0) {
                local_174 = 0xffffffff;
              }
              else {
                local_174 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
              }
              sdw_mask = local_174;
              dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
              dst32addr._0_4_ = local_174 & dst32addr._4_4_;
              srcLshift = ((int)(dstold + iVar3) >> 5) + -1;
            }
            _preloop_mask = _preloop_mask + ((int)uVar4 >> 5);
            uVar4 = uVar5;
            if (bVar14) {
              uVar4 = uVar5 + dst32lbit;
              dst32lbit = uVar4 & 0x1f;
              OrigSrcAddr._4_4_ = (dst32lbit + iVar3) - 1U & 0x1f;
              local_110 = dstold - dst32lbit & 0x1f;
              srcRmask = dst32lbit - dstold & 0x1f;
              if (srcRmask == 0) {
                local_178 = 0xffffffff;
              }
              else {
                local_178 = -1 << (sbyte)srcRmask ^ 0xffffffff;
              }
              dstdata = local_178;
            }
            OrigDstAddr = OrigDstAddr + ((int)uVar4 >> 5);
            src32lbit = src32lbit + -1;
          }
          if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
            flush_display_lineregion((long)(int)local_20,ybase,iVar3,h_00);
          }
          ScreenLocked = 0;
        }
      }
      else if ((BLTCHAR_index != 0) ||
              (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
              BLTCHAR_index != 0xffffffff)) {
        MachineState.csp = MachineState.csp + 4;
        ccfuncall(BLTCHAR_index,3,3);
      }
    }
    else if ((BLTCHAR_index != 0) ||
            (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
            BLTCHAR_index != 0xffffffff)) {
      MachineState.csp = MachineState.csp + 4;
      ccfuncall(BLTCHAR_index,3,3);
    }
  }
  else if ((BLTCHAR_index != 0) ||
          (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
          BLTCHAR_index != 0xffffffff)) {
    MachineState.csp = MachineState.csp + 4;
    ccfuncall(BLTCHAR_index,3,3);
  }
  return;
}

Assistant:

void newbltchar(LispPTR *args) {
  DISPLAYDATA *displaydata68k;
  int right, left, curx;
  PILOTBBT *pbt;
  int lmargin, rmargin, xoff;
  int base;
  int h, w;
#ifdef REALCURSOR
  int displayflg;
#endif
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  displaydata68k = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTARG *)args)->displaydata);

  if ((displaydata68k->ddcharset & 0xFFFF) != ((BLTARG *)args)->charset) {
    /*if(changecharset_display(displaydata68k, ((BLTARG *)args)->charset) ==-1)*/
    PUNT_TO_BLTCHAR;
  }

  if (displaydata68k->ddslowprintingcase) { PUNT_TO_BLTCHAR; /** \SLOWBLTCHAR--return;**/ }

  FGetNum(displaydata68k->ddxposition, curx);
  FGetNum(displaydata68k->ddrightmargin, rmargin);
  FGetNum(displaydata68k->ddleftmargin, lmargin);
  FGetNum(displaydata68k->ddxoffset, xoff);

  right =
      curx +
      GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddcharimagewidths + ((BLTARG *)args)->char8code));

  if ((right > rmargin) && (curx > lmargin)) PUNT_TO_BLTCHAR;
  if (((BLTARG *)args)->displaystream != *TOPWDS68k) PUNT_TO_BLTCHAR;

  {
    int newpos;
    newpos = curx +
             GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddwidthscache + ((BLTARG *)args)->char8code));

    if ((0 <= newpos) && (newpos < 65536))
      (displaydata68k->ddxposition) = (LispPTR)(S_POSITIVE | newpos);
    else if (-65537 < newpos)
      (displaydata68k->ddxposition) = (LispPTR)(S_NEGATIVE | (0xffff & newpos));
    else {
      PUNT_TO_BLTCHAR;
    }
  }

  curx += xoff;
  right += xoff;
  if (right > (int)(displaydata68k->ddclippingright)) right = displaydata68k->ddclippingright;

  if (curx > (int)(displaydata68k->ddclippingleft))
    left = curx;
  else
    left = displaydata68k->ddclippingleft;

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(displaydata68k->ddpilotbbt);
  h = pbt->pbtheight;
  w = right - left;
  if ((h <= 0) || (w <= 0)) return;

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  base = GETWORD(NativeAligned2FromLAddr(displaydata68k->ddoffsetscache + ((BLTARG *)args)->char8code));
  sx = base + left - curx;
  dx = left;

  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg = (cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (left >> 4)), (right - left),
                         pbt->pbtheight, pbt->pbtbackward));
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("newbltchar:  x %d, y 0x%x, w %d, h %d.\n", dx, dstbase, w, h));*/
      flush_display_lineregion(dx, dstbase, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */
#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */
#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

}